

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_clnpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,OPJ_UINT32 ci
               ,OPJ_UINT32 vsc)

{
  OPJ_UINT32 *pOVar1;
  byte *pbVar2;
  byte bVar3;
  opj_mqc_state_t *poVar4;
  OPJ_BYTE *pOVar5;
  OPJ_INT32 OVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  opj_mqc_state_t **ppoVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  uint uVar16;
  
  bVar8 = (char)ci * '\x03';
  if ((*flagsp >> (bVar8 & 0x1f) & 0x200010) == 0) {
    ppoVar13 = (t1->mqc).ctxs + (t1->mqc).lut_ctxno_zc_orient[*flagsp >> (bVar8 & 0x1f) & 0x1ef];
    (t1->mqc).curctx = ppoVar13;
    poVar4 = *ppoVar13;
    uVar16 = poVar4->qeval;
    uVar10 = (t1->mqc).c;
    uVar15 = (t1->mqc).a - uVar16;
    (t1->mqc).a = uVar15;
    if (uVar10 >> 0x10 < uVar16) {
      uVar7 = (uint)(poVar4->mps == 0);
      if (uVar16 > uVar15) {
        uVar7 = poVar4->mps;
      }
      (t1->mqc).a = uVar16;
      *ppoVar13 = (&poVar4->nmps)[uVar16 <= uVar15];
      OVar11 = (t1->mqc).ct;
      do {
        if (OVar11 == 0) {
          pOVar5 = (t1->mqc).bp;
          bVar3 = pOVar5[1];
          if (*pOVar5 == 0xff) {
            if (bVar3 < 0x90) {
              (t1->mqc).bp = pOVar5 + 1;
              uVar10 = uVar10 + (uint)bVar3 * 0x200;
              OVar11 = 7;
              goto LAB_00130afe;
            }
            uVar10 = uVar10 + 0xff00;
            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
            *pOVar1 = *pOVar1 + 1;
          }
          else {
            (t1->mqc).bp = pOVar5 + 1;
            uVar10 = uVar10 + (uint)bVar3 * 0x100;
          }
          OVar11 = 8;
        }
LAB_00130afe:
        uVar16 = uVar16 * 2;
        (t1->mqc).a = uVar16;
        uVar10 = uVar10 * 2;
        (t1->mqc).c = uVar10;
        OVar11 = OVar11 - 1;
        (t1->mqc).ct = OVar11;
      } while (uVar16 < 0x8000);
    }
    else {
      uVar10 = uVar10 + uVar16 * -0x10000;
      (t1->mqc).c = uVar10;
      if ((short)uVar15 < 0) {
        uVar7 = poVar4->mps;
        uVar16 = uVar15;
      }
      else {
        uVar7 = (uint)(poVar4->mps == 0);
        if (uVar15 >= uVar16) {
          uVar7 = poVar4->mps;
        }
        *ppoVar13 = (&poVar4->nmps)[uVar15 < uVar16];
        OVar11 = (t1->mqc).ct;
        uVar16 = uVar15;
        do {
          if (OVar11 == 0) {
            pOVar5 = (t1->mqc).bp;
            bVar3 = pOVar5[1];
            if (*pOVar5 == 0xff) {
              if (bVar3 < 0x90) {
                (t1->mqc).bp = pOVar5 + 1;
                uVar10 = uVar10 + (uint)bVar3 * 0x200;
                OVar11 = 7;
                goto LAB_00130ba0;
              }
              uVar10 = uVar10 + 0xff00;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar5 + 1;
              uVar10 = uVar10 + (uint)bVar3 * 0x100;
            }
            OVar11 = 8;
          }
LAB_00130ba0:
          uVar16 = uVar16 * 2;
          (t1->mqc).a = uVar16;
          uVar10 = uVar10 * 2;
          (t1->mqc).c = uVar10;
          OVar11 = OVar11 - 1;
          (t1->mqc).ct = OVar11;
        } while (uVar16 < 0x8000);
      }
    }
    if (uVar7 != 0) {
      OVar11 = opj_t1_getctxtno_sc_or_spb_index(*flagsp,flagsp[-1],flagsp[1],ci);
      bVar3 = "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
              [OVar11];
      ppoVar13 = (t1->mqc).ctxs + bVar3;
      (t1->mqc).curctx = ppoVar13;
      poVar4 = (t1->mqc).ctxs[bVar3];
      uVar15 = poVar4->qeval;
      uVar16 = uVar16 - uVar15;
      (t1->mqc).a = uVar16;
      if (uVar10 >> 0x10 < uVar15) {
        uVar7 = (uint)(poVar4->mps == 0);
        if (uVar15 > uVar16) {
          uVar7 = poVar4->mps;
        }
        (t1->mqc).a = uVar15;
        *ppoVar13 = (&poVar4->nmps)[uVar15 <= uVar16];
        OVar14 = (t1->mqc).ct;
        do {
          if (OVar14 == 0) {
            pOVar5 = (t1->mqc).bp;
            bVar3 = pOVar5[1];
            if (*pOVar5 == 0xff) {
              if (bVar3 < 0x90) {
                (t1->mqc).bp = pOVar5 + 1;
                uVar10 = uVar10 + (uint)bVar3 * 0x200;
                OVar14 = 7;
                goto LAB_00130caa;
              }
              uVar10 = uVar10 + 0xff00;
              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
              *pOVar1 = *pOVar1 + 1;
            }
            else {
              (t1->mqc).bp = pOVar5 + 1;
              uVar10 = uVar10 + (uint)bVar3 * 0x100;
            }
            OVar14 = 8;
          }
LAB_00130caa:
          uVar15 = uVar15 * 2;
          (t1->mqc).a = uVar15;
          uVar10 = uVar10 * 2;
          (t1->mqc).c = uVar10;
          OVar14 = OVar14 - 1;
          (t1->mqc).ct = OVar14;
        } while (uVar15 < 0x8000);
      }
      else {
        OVar14 = uVar10 + uVar15 * -0x10000;
        (t1->mqc).c = OVar14;
        if ((short)uVar16 < 0) {
          uVar7 = poVar4->mps;
        }
        else {
          uVar7 = (uint)(poVar4->mps == 0);
          if (uVar16 >= uVar15) {
            uVar7 = poVar4->mps;
          }
          *ppoVar13 = (&poVar4->nmps)[uVar16 < uVar15];
          OVar12 = (t1->mqc).ct;
          do {
            if (OVar12 == 0) {
              pOVar5 = (t1->mqc).bp;
              bVar3 = pOVar5[1];
              if (*pOVar5 == 0xff) {
                if (bVar3 < 0x90) {
                  (t1->mqc).bp = pOVar5 + 1;
                  OVar14 = OVar14 + (uint)bVar3 * 0x200;
                  OVar12 = 7;
                  goto LAB_00130d54;
                }
                OVar14 = OVar14 + 0xff00;
                pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                *pOVar1 = *pOVar1 + 1;
              }
              else {
                (t1->mqc).bp = pOVar5 + 1;
                OVar14 = OVar14 + (uint)bVar3 * 0x100;
              }
              OVar12 = 8;
            }
LAB_00130d54:
            uVar16 = uVar16 * 2;
            (t1->mqc).a = uVar16;
            OVar14 = OVar14 * 2;
            (t1->mqc).c = OVar14;
            OVar12 = OVar12 - 1;
            (t1->mqc).ct = OVar12;
          } while (uVar16 < 0x8000);
        }
      }
      uVar16 = uVar7 ^ ""[OVar11];
      OVar6 = -oneplushalf;
      if (uVar7 == ""[OVar11]) {
        OVar6 = oneplushalf;
      }
      *datap = OVar6;
      flagsp[-1] = flagsp[-1] | 0x20 << (bVar8 & 0x1f);
      *flagsp = *flagsp | (uVar16 << 0x13 | 0x10) << (bVar8 & 0x1f);
      flagsp[1] = flagsp[1] | 8 << (bVar8 & 0x1f);
      if (vsc == 0 && ci == 0) {
        uVar10 = t1->w + 2;
        *(ulong *)(flagsp + (-1 - (ulong)uVar10)) =
             CONCAT44(uVar16 << 0x1f,0x20000) | 0x1000000000000 |
             *(ulong *)(flagsp + (-1 - (ulong)uVar10));
        pbVar2 = (byte *)((long)flagsp + (ulong)uVar10 * -4 + 5);
        *pbVar2 = *pbVar2 | 0x80;
      }
      if (ci == 3) {
        uVar9 = (ulong)(t1->w + 2);
        *(ulong *)(flagsp + (uVar9 - 1)) =
             CONCAT44(uVar16 << 0x12,4) | 0x200000000 | *(ulong *)(flagsp + (uVar9 - 1));
        *(byte *)(flagsp + uVar9 + 1) = (byte)flagsp[uVar9 + 1] | 1;
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_clnpass_step(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 ci,
    OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */
    opj_t1_dec_clnpass_step_macro(OPJ_TRUE, OPJ_FALSE,
                                  *flagsp, flagsp, t1->w + 2U, datap,
                                  0, ci, mqc, mqc->curctx,
                                  v, mqc->a, mqc->c, mqc->ct, oneplushalf, vsc);
}